

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

void * mraa_gpio_interrupt_handler(void *arg)

{
  uint uVar1;
  code *pcVar2;
  int iVar3;
  mraa_boolean_t mVar4;
  mraa_result_t mVar5;
  int *fds;
  char *pcVar6;
  int k;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  mraa_gpio_context it;
  uint *puVar10;
  ulong uVar11;
  char bu [64];
  
  if (arg == (void *)0x0) {
    pcVar6 = "gpio: interrupt_handler: context is invalid";
  }
  else {
    if (((*(long *)((long)arg + 0x48) != 0) &&
        (pcVar2 = *(code **)(*(long *)((long)arg + 0x48) + 0x90), pcVar2 != (code *)0x0)) &&
       (iVar3 = (*pcVar2)(arg), iVar3 != 0)) {
      return (void *)0x0;
    }
    fds = (int *)calloc((ulong)*(uint *)((long)arg + 0x68),4);
    if (fds != (int *)0x0) {
      mVar4 = mraa_is_sub_platform_id(*arg);
      uVar11 = 0;
      if (mVar4 == 0) {
        if (plat->chardev_capable == 0) {
          uVar11 = 0;
          for (puVar10 = (uint *)arg; puVar10 != (uint *)0x0; puVar10 = *(uint **)(puVar10 + 0x20))
          {
            snprintf(bu,0x40,"/sys/class/gpio/gpio%d/value",(ulong)*puVar10);
            iVar3 = open(bu,0);
            fds[uVar11] = iVar3;
            if (iVar3 < 0) {
              uVar1 = *puVar10;
              piVar8 = __errno_location();
              pcVar6 = strerror(*piVar8);
              syslog(3,"gpio%i: interrupt_handler: failed to open \'value\' : %s",(ulong)uVar1,
                     pcVar6);
              iVar3 = (int)uVar11;
              goto LAB_0010ae3c;
            }
            uVar11 = uVar11 + 1;
          }
        }
        else {
          uVar1 = *(uint *)((long)arg + 0x58);
          uVar7 = 0;
          uVar11 = 0;
          while ((uVar7 != uVar1 && (*(long *)((long)arg + 0x50) != 0))) {
            piVar8 = (int *)(*(long *)((long)arg + 0x50) + uVar7 * 0x40);
            if (*piVar8 != 0) {
              for (uVar9 = 0; uVar9 < (uint)piVar8[4]; uVar9 = uVar9 + 1) {
                fds[(long)(int)uVar11 + uVar9] = *(int *)(*(long *)(piVar8 + 0xe) + uVar9 * 4);
              }
              uVar11 = (ulong)(uint)((int)uVar11 + (int)uVar9);
            }
            uVar7 = uVar7 + 1;
          }
        }
      }
      if (((lang_func->java_attach_thread != (_func_mraa_result_t_varargs *)0x0) &&
          (*(_func_void_void_ptr **)((long)arg + 0x10) == lang_func->java_isr_callback)) &&
         (mVar5 = (*lang_func->java_attach_thread)(), mVar5 != MRAA_SUCCESS)) {
        iVar3 = *(int *)((long)arg + 0x68);
LAB_0010ae3c:
        mraa_gpio_close_event_handles_sysfs(fds,iVar3);
        return (void *)0x0;
      }
      do {
        if ((*(long *)((long)arg + 0x48) == 0) ||
           (pcVar2 = *(code **)(*(long *)((long)arg + 0x48) + 0x98), pcVar2 == (code *)0x0)) {
          if (plat->chardev_capable == 0) {
            mraa_gpio_wait_interrupt(fds,(int)uVar11,*(mraa_gpio_events_t *)((long)arg + 0x70));
          }
          else {
            mraa_gpio_chardev_wait_interrupt
                      (fds,(int)uVar11,*(mraa_gpio_events_t *)((long)arg + 0x70));
          }
        }
        else {
          iVar3 = (*pcVar2)(arg);
          if (iVar3 != 0) {
LAB_0010acdd:
            pthread_setcancelstate(1,(int *)0x0);
            mraa_gpio_close_event_handles_sysfs(fds,*(int *)((long)arg + 0x68));
            if (lang_func->java_detach_thread == (_func_void_varargs *)0x0) {
              return (void *)0x0;
            }
            if (lang_func->java_delete_global_ref == (_func_void_void_ptr *)0x0) {
              return (void *)0x0;
            }
            if (*(_func_void_void_ptr **)((long)arg + 0x10) != lang_func->java_isr_callback) {
              return (void *)0x0;
            }
            (*lang_func->java_delete_global_ref)(*(void **)((long)arg + 0x18));
            (*lang_func->java_detach_thread)();
            return (void *)0x0;
          }
        }
        if (*(int *)((long)arg + 0x2c) != 0) goto LAB_0010acdd;
        pthread_setcancelstate(1,(int *)0x0);
        if (lang_func->python_isr == (_func_void__func_void_void_ptr_ptr_void_ptr *)0x0) {
          (**(_func_void_void_ptr **)((long)arg + 0x10))();
        }
        else {
          (*lang_func->python_isr)
                    (*(_func_void_void_ptr **)((long)arg + 0x10),*(void **)((long)arg + 0x18));
        }
        pthread_setcancelstate(0,(int *)0x0);
      } while( true );
    }
    pcVar6 = "mraa_gpio_interrupt_handler_multiple() malloc error";
  }
  syslog(3,pcVar6);
  return (void *)0x0;
}

Assistant:

static void*
mraa_gpio_interrupt_handler(void* arg)
{
    if (arg == NULL) {
        syslog(LOG_ERR, "gpio: interrupt_handler: context is invalid");
        return NULL;
    }

    mraa_result_t ret;
    mraa_gpio_context dev = (mraa_gpio_context) arg;
    int idx = 0;

    if (IS_FUNC_DEFINED(dev, gpio_interrupt_handler_init_replace)) {
        if (dev->advance_func->gpio_interrupt_handler_init_replace(dev) != MRAA_SUCCESS)
            return NULL;
    }

    int* fps = calloc(dev->num_pins, sizeof(int));
    if (!fps) {
        syslog(LOG_ERR, "mraa_gpio_interrupt_handler_multiple() malloc error");
        return NULL;
    }

    /* Is this pin on a subplatform? Do nothing... */
    if (mraa_is_sub_platform_id(dev->pin)) {
    }
    /* Is the platform chardev_capable? */
    else if (plat->chardev_capable) {
        mraa_gpiod_group_t gpio_group;

        for_each_gpio_group(gpio_group, dev)
        {
            for (int i = 0; i < gpio_group->num_gpio_lines; ++i) {
                fps[idx++] = gpio_group->event_handles[i];
            }
        }
    }
    /* Else, attempt fs access */
    else {
        mraa_gpio_context it = dev;

        while (it) {
            // open gpio value with open(3)
            char bu[MAX_SIZE];
            snprintf(bu, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/value", it->pin);
            fps[idx] = open(bu, O_RDONLY);
            if (fps[idx] < 0) {
                syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to open 'value' : %s", it->pin,
                       strerror(errno));
                mraa_gpio_close_event_handles_sysfs(fps, idx);
                return NULL;
            }

            idx++;
            it = it->next;
        }
    }

#ifndef HAVE_PTHREAD_CANCEL
    if (pipe(dev->isr_control_pipe)) {
        syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to create isr control pipe: %s",
               dev->pin, strerror(errno));
        mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);
        return NULL;
    }
#endif

    if (lang_func->java_attach_thread != NULL) {
        if (dev->isr == lang_func->java_isr_callback) {
            if (lang_func->java_attach_thread() != MRAA_SUCCESS) {
                mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);
                return NULL;
            }
        }
    }

    for (;;) {
        if (IS_FUNC_DEFINED(dev, gpio_wait_interrupt_replace)) {
            ret = dev->advance_func->gpio_wait_interrupt_replace(dev);
        } else {
            if (plat->chardev_capable) {
                ret = mraa_gpio_chardev_wait_interrupt(fps, idx, dev->events);
            } else {
                ret = mraa_gpio_wait_interrupt(fps, idx
#ifndef HAVE_PTHREAD_CANCEL
                                               ,
                                               dev->isr_control_pipe[0]
#endif
                                               ,
                                               dev->events);
            }
        }

        if (ret == MRAA_SUCCESS && !dev->isr_thread_terminating) {
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            if (lang_func->python_isr != NULL) {
                lang_func->python_isr(dev->isr, dev->isr_args);
            } else {
                dev->isr(dev->isr_args);
            }
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
#endif
        } else {
            // we must have got an error code or exit request so die nicely
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);

            if (lang_func->java_detach_thread != NULL && lang_func->java_delete_global_ref != NULL) {
                if (dev->isr == lang_func->java_isr_callback) {
                    lang_func->java_delete_global_ref(dev->isr_args);
                    lang_func->java_detach_thread();
                }
            }

            return NULL;
        }
    }
}